

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_msa_st_b_mips(CPUMIPSState *env,uint32_t wd,target_ulong_conflict addr)

{
  uint uVar1;
  long lVar2;
  uintptr_t unaff_retaddr;
  
  uVar1 = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    uVar1 = env->hflags & 3;
  }
  if (0xff0 < (addr & 0xfff)) {
    helper_msa_st_b_mips_cold_1();
  }
  uVar1 = uVar1 | 0x780;
  lVar2 = (ulong)wd * 0x10;
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr,*(uint8_t *)((env->active_fpu).fpr + wd),uVar1,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 1,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 1),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 2,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 2),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 3,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 3),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 4,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 4),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 5,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 5),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 6,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 6),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 7,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 7),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 8,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 8),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 9,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 9),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 10,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 10),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xb,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 0xb),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xc,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 0xc),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xd,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 0xd),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xe,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 0xe),uVar1,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xf,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar2 + 0xf),uVar1,unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_b(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_BYTE)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
#if !defined(HOST_WORDS_BIGENDIAN)
    helper_ret_stb_mmu(env, addr + (0  << DF_BYTE), pwd->b[0],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (1  << DF_BYTE), pwd->b[1],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (2  << DF_BYTE), pwd->b[2],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (3  << DF_BYTE), pwd->b[3],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (4  << DF_BYTE), pwd->b[4],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (5  << DF_BYTE), pwd->b[5],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (6  << DF_BYTE), pwd->b[6],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (7  << DF_BYTE), pwd->b[7],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (8  << DF_BYTE), pwd->b[8],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (9  << DF_BYTE), pwd->b[9],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (10 << DF_BYTE), pwd->b[10], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (11 << DF_BYTE), pwd->b[11], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (12 << DF_BYTE), pwd->b[12], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (13 << DF_BYTE), pwd->b[13], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (14 << DF_BYTE), pwd->b[14], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (15 << DF_BYTE), pwd->b[15], oi, GETPC());
#else
    helper_ret_stb_mmu(env, addr + (7  << DF_BYTE), pwd->b[0],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (6  << DF_BYTE), pwd->b[1],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (5  << DF_BYTE), pwd->b[2],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (4  << DF_BYTE), pwd->b[3],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (3  << DF_BYTE), pwd->b[4],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (2  << DF_BYTE), pwd->b[5],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (1  << DF_BYTE), pwd->b[6],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (0  << DF_BYTE), pwd->b[7],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (15 << DF_BYTE), pwd->b[8],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (14 << DF_BYTE), pwd->b[9],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (13 << DF_BYTE), pwd->b[10], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (12 << DF_BYTE), pwd->b[11], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (11 << DF_BYTE), pwd->b[12], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (10 << DF_BYTE), pwd->b[13], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (9  << DF_BYTE), pwd->b[14], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (8  << DF_BYTE), pwd->b[15], oi, GETPC());
#endif
}